

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlCheckVersion(int version)

{
  int myversion;
  int version_local;
  
  xmlInitParser();
  if (version / 10000 == 2) {
    if (0xd6 < version / 100) {
      xmlPrintErrorMessage
                ("Warning: program compiled against libxml %d using older %d\n",
                 (long)version / 100 & 0xffffffff,0xd6);
    }
  }
  else {
    xmlPrintErrorMessage
              ("Fatal: program compiled against libxml %d using libxml %d\n",
               (long)version / 10000 & 0xffffffff,2);
  }
  return;
}

Assistant:

void
xmlCheckVersion(int version) {
    int myversion = LIBXML_VERSION;

    xmlInitParser();

    if ((myversion / 10000) != (version / 10000)) {
	xmlPrintErrorMessage(
		"Fatal: program compiled against libxml %d using libxml %d\n",
		(version / 10000), (myversion / 10000));
    } else if ((myversion / 100) < (version / 100)) {
	xmlPrintErrorMessage(
		"Warning: program compiled against libxml %d using older %d\n",
		(version / 100), (myversion / 100));
    }
}